

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture2D_GL.cpp
# Opt level: O3

void __thiscall
Diligent::Texture2D_GL::Texture2D_GL
          (Texture2D_GL *this,IReferenceCounters *pRefCounters,
          FixedBlockMemoryAllocator *TexViewObjAllocator,RenderDeviceGLImpl *pDeviceGL,
          GLContextState *GLState,TextureDesc *TexDesc,GLuint GLTextureHandle,GLuint GLBindTarget,
          bool bIsDeviceInternal)

{
  GLenum BindTarget;
  
  BindTarget = 0xde1;
  if (1 < TexDesc->SampleCount) {
    BindTarget = 0x9100;
  }
  if (GLBindTarget != 0) {
    BindTarget = GLBindTarget;
  }
  TextureBaseGL::TextureBaseGL
            (&this->super_TextureBaseGL,pRefCounters,TexViewObjAllocator,pDeviceGL,GLState,TexDesc,
             GLTextureHandle,BindTarget,bIsDeviceInternal);
  (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>.
  super_ObjectBase<Diligent::ITextureGL>.super_RefCountedObject<Diligent::ITextureGL>.
  super_ITextureGL.super_ITexture = (ITexture)&PTR_QueryInterface_00af3638;
  return;
}

Assistant:

Texture2D_GL::Texture2D_GL(IReferenceCounters*        pRefCounters,
                           FixedBlockMemoryAllocator& TexViewObjAllocator,
                           RenderDeviceGLImpl*        pDeviceGL,
                           GLContextState&            GLState,
                           const TextureDesc&         TexDesc,
                           GLuint                     GLTextureHandle,
                           GLuint                     GLBindTarget,
                           bool                       bIsDeviceInternal) :
    // clang-format off
    TextureBaseGL
    {
        pRefCounters,
        TexViewObjAllocator,
        pDeviceGL,
        GLState,
        TexDesc,
        GLTextureHandle,
        GLBindTarget != 0 ?
            static_cast<GLenum>(GLBindTarget) :
            static_cast<GLenum>(TexDesc.SampleCount > 1 ? GL_TEXTURE_2D_MULTISAMPLE : GL_TEXTURE_2D),
        bIsDeviceInternal
    }
// clang-format on
{
}